

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.cpp
# Opt level: O3

DOMElement * __thiscall
xercesc_4_0::SchemaInfo::getTopLevelComponent
          (SchemaInfo *this,unsigned_short compCategory,XMLCh *compName,XMLCh *name)

{
  short sVar1;
  short sVar2;
  XMLCh XVar3;
  MemoryManager *pMVar4;
  XMLSize_t XVar5;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar6;
  ulong uVar7;
  bool bVar8;
  int iVar9;
  DOMNode *parent;
  ulong uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  short *psVar11;
  XMLCh *pXVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *node_00;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLCh *pXVar13;
  XMLSize_t XVar14;
  short *psVar15;
  ulong uVar16;
  XMLCh XVar17;
  RefHashTableBucketElem<xercesc_4_0::DOMElement> *pRVar18;
  RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *local_48;
  DOMNode *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (6 < compCategory || &this->fSchemaRootElement->super_DOMNode == (DOMNode *)0x0) {
    return (DOMElement *)0x0;
  }
  parent = &XUtil::getFirstChildElement(&this->fSchemaRootElement->super_DOMNode)->super_DOMNode;
  if (parent == (DOMNode *)0x0) {
    return (DOMElement *)0x0;
  }
  local_48 = this->fTopLevelComponents[compCategory];
  if (local_48 == (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)0x0) {
    local_48 = (RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x38,this->fMemoryManager);
    pMVar4 = this->fMemoryManager;
    local_48->fMemoryManager = pMVar4;
    local_48->fAdoptedElems = false;
    local_48->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DOMElement> **)0x0;
    local_48->fHashModulus = 0x11;
    local_48->fInitialModulus = 0x11;
    local_48->fCount = 0;
    iVar9 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,0x88);
    local_48->fBucketList =
         (RefHashTableBucketElem<xercesc_4_0::DOMElement> **)CONCAT44(extraout_var,iVar9);
    XVar5 = local_48->fHashModulus;
    if (XVar5 != 0) {
      XVar14 = 0;
      do {
        local_48->fBucketList[XVar14] = (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0;
        XVar14 = XVar14 + 1;
      } while (XVar5 != XVar14);
    }
    this->fTopLevelComponents[compCategory] = local_48;
  }
  else {
    if ((name == (XMLCh *)0x0) || (uVar10 = (ulong)(ushort)*name, uVar10 == 0)) {
      uVar10 = 0;
    }
    else {
      XVar17 = name[1];
      if (XVar17 != L'\0') {
        pXVar12 = name + 2;
        do {
          uVar10 = (ulong)(ushort)XVar17 + (uVar10 >> 0x18) + uVar10 * 0x26;
          XVar17 = *pXVar12;
          pXVar12 = pXVar12 + 1;
        } while (XVar17 != L'\0');
      }
      uVar10 = uVar10 % local_48->fHashModulus;
    }
    pRVar18 = local_48->fBucketList[uVar10];
    if (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0) {
      do {
        bVar8 = StringHasher::equals((StringHasher *)&local_48->field_0x30,name,pRVar18->fKey);
        if (bVar8) {
          if (pRVar18->fData != (DOMElement *)0x0) {
            return pRVar18->fData;
          }
          break;
        }
        pRVar18 = pRVar18->fNext;
      } while (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::DOMElement> *)0x0);
    }
    parent = &this->fLastTopLevelComponent[compCategory]->super_DOMNode;
  }
  iVar9 = (*((DOMNode *)&parent->_vptr_DOMNode)->_vptr_DOMNode[5])(parent);
  node = (DOMNode *)CONCAT44(extraout_var_00,iVar9);
  iVar9 = (*node->_vptr_DOMNode[0x18])(node);
  psVar11 = (short *)CONCAT44(extraout_var_01,iVar9);
  if (psVar11 != &SchemaSymbols::fgELT_REDEFINE) {
    psVar15 = &SchemaSymbols::fgELT_REDEFINE;
    if (psVar11 == (short *)0x0) {
LAB_00315209:
      if (*psVar15 == 0) goto LAB_00315212;
    }
    else {
      do {
        sVar1 = *psVar11;
        if (sVar1 == 0) goto LAB_00315209;
        psVar11 = psVar11 + 1;
        sVar2 = *psVar15;
        psVar15 = psVar15 + 1;
      } while (sVar1 == sVar2);
    }
    node = (DOMNode *)0x0;
  }
LAB_00315212:
  do {
    this->fLastTopLevelComponent[compCategory] = (DOMElement *)parent;
    iVar9 = (*parent->_vptr_DOMNode[0x18])(parent);
    pXVar12 = (XMLCh *)CONCAT44(extraout_var_02,iVar9);
    if (pXVar12 == compName) {
LAB_003152dd:
      iVar9 = (*parent->_vptr_DOMNode[0x29])(parent,SchemaSymbols::fgATT_NAME);
      pXVar12 = (XMLCh *)CONCAT44(extraout_var_04,iVar9);
      RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                (local_48,pXVar12,(DOMElement *)parent);
      if (pXVar12 == name) {
        return (DOMElement *)parent;
      }
      pXVar13 = name;
      if ((name == (XMLCh *)0x0) || (pXVar12 == (XMLCh *)0x0)) {
        if (pXVar12 == (XMLCh *)0x0) {
          if (name == (XMLCh *)0x0) {
            return (DOMElement *)parent;
          }
        }
        else if ((name == (XMLCh *)0x0) || (*pXVar12 != L'\0')) {
          if (*pXVar12 == L'\0') {
            return (DOMElement *)parent;
          }
          goto LAB_00315528;
        }
LAB_00315522:
        if (*pXVar13 == L'\0') {
          return (DOMElement *)parent;
        }
      }
      else {
        do {
          XVar17 = *pXVar12;
          if (XVar17 == L'\0') goto LAB_00315522;
          pXVar12 = pXVar12 + 1;
          XVar3 = *pXVar13;
          pXVar13 = pXVar13 + 1;
        } while (XVar17 == XVar3);
      }
    }
    else {
      pXVar13 = compName;
      if ((compName == (XMLCh *)0x0) || (pXVar12 == (XMLCh *)0x0)) {
        if (pXVar12 == (XMLCh *)0x0) {
          if (compName == (XMLCh *)0x0) goto LAB_003152dd;
LAB_00315285:
          XVar17 = *pXVar13;
        }
        else {
          XVar17 = *pXVar12;
          if ((compName != (XMLCh *)0x0) && (XVar17 == L'\0')) goto LAB_00315285;
        }
        if (XVar17 == L'\0') goto LAB_003152dd;
      }
      else {
        do {
          XVar17 = *pXVar12;
          if (XVar17 == L'\0') goto LAB_00315285;
          pXVar12 = pXVar12 + 1;
          XVar3 = *pXVar13;
          pXVar13 = pXVar13 + 1;
        } while (XVar17 == XVar3);
      }
      iVar9 = (*parent->_vptr_DOMNode[0x18])(parent);
      psVar11 = (short *)CONCAT44(extraout_var_03,iVar9);
      if (psVar11 == &SchemaSymbols::fgELT_REDEFINE) {
LAB_00315373:
        pVVar6 = this->fFailedRedefineList;
        if ((pVVar6 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) ||
           (uVar10 = pVVar6->fCurCount, uVar10 == 0)) {
LAB_003153b2:
          for (node_00 = &XUtil::getFirstChildElement(parent)->super_DOMNode;
              node_00 != (DOMNode *)0x0;
              node_00 = &XUtil::getNextSiblingElement(node_00)->super_DOMNode) {
            this->fLastTopLevelComponent[compCategory] = (DOMElement *)node_00;
            pVVar6 = this->fFailedRedefineList;
            if ((pVVar6 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) ||
               (uVar10 = pVVar6->fCurCount, uVar10 == 0)) {
LAB_00315412:
              iVar9 = (*node_00->_vptr_DOMNode[0x18])(node_00);
              pXVar12 = (XMLCh *)CONCAT44(extraout_var_05,iVar9);
              if (pXVar12 != compName) {
                pXVar13 = compName;
                if ((compName != (XMLCh *)0x0) && (pXVar12 != (XMLCh *)0x0)) {
                  do {
                    XVar17 = *pXVar12;
                    if (XVar17 == L'\0') goto LAB_00315476;
                    pXVar12 = pXVar12 + 1;
                    XVar3 = *pXVar13;
                    pXVar13 = pXVar13 + 1;
                  } while (XVar17 == XVar3);
                  goto LAB_00315504;
                }
                if (pXVar12 == (XMLCh *)0x0) {
                  if (compName == (XMLCh *)0x0) goto LAB_00315480;
LAB_00315476:
                  XVar17 = *pXVar13;
                }
                else {
                  XVar17 = *pXVar12;
                  if ((compName != (XMLCh *)0x0) && (XVar17 == L'\0')) goto LAB_00315476;
                }
                if (XVar17 != L'\0') goto LAB_00315504;
              }
LAB_00315480:
              iVar9 = (*node_00->_vptr_DOMNode[0x29])(node_00,SchemaSymbols::fgATT_NAME);
              pXVar12 = (XMLCh *)CONCAT44(extraout_var_06,iVar9);
              RefHashTableOf<xercesc_4_0::DOMElement,_xercesc_4_0::StringHasher>::put
                        (local_48,pXVar12,(DOMElement *)node_00);
              if (pXVar12 == name) {
                return (DOMElement *)node_00;
              }
              pXVar13 = name;
              if ((name == (XMLCh *)0x0) || (pXVar12 == (XMLCh *)0x0)) {
                if (pXVar12 == (XMLCh *)0x0) {
                  if (name == (XMLCh *)0x0) {
                    return (DOMElement *)node_00;
                  }
                }
                else if ((name == (XMLCh *)0x0) || (*pXVar12 != L'\0')) {
                  if (*pXVar12 == L'\0') {
                    return (DOMElement *)node_00;
                  }
                  goto LAB_00315504;
                }
LAB_003154fe:
                if (*pXVar13 == L'\0') {
                  return (DOMElement *)node_00;
                }
              }
              else {
                do {
                  XVar17 = *pXVar12;
                  if (XVar17 == L'\0') goto LAB_003154fe;
                  pXVar12 = pXVar12 + 1;
                  XVar3 = *pXVar13;
                  pXVar13 = pXVar13 + 1;
                } while (XVar17 == XVar3);
              }
            }
            else if (&(*pVVar6->fElemList)->super_DOMNode != node_00) {
              uVar7 = 1;
              do {
                uVar16 = uVar7;
                if (uVar10 == uVar16) break;
                uVar7 = uVar16 + 1;
              } while (&pVVar6->fElemList[uVar16]->super_DOMNode != node_00);
              if (uVar10 <= uVar16) goto LAB_00315412;
            }
LAB_00315504:
          }
        }
        else if (&(*pVVar6->fElemList)->super_DOMNode != parent) {
          uVar7 = 1;
          do {
            uVar16 = uVar7;
            if (uVar10 == uVar16) break;
            uVar7 = uVar16 + 1;
          } while (&pVVar6->fElemList[uVar16]->super_DOMNode != parent);
          if (uVar10 <= uVar16) goto LAB_003153b2;
        }
      }
      else {
        psVar15 = &SchemaSymbols::fgELT_REDEFINE;
        if (psVar11 == (short *)0x0) {
LAB_00315369:
          if (*psVar15 == 0) goto LAB_00315373;
        }
        else {
          psVar15 = &SchemaSymbols::fgELT_REDEFINE;
          do {
            sVar1 = *psVar11;
            if (sVar1 == 0) goto LAB_00315369;
            psVar11 = psVar11 + 1;
            sVar2 = *psVar15;
            psVar15 = psVar15 + 1;
          } while (sVar1 == sVar2);
        }
      }
    }
LAB_00315528:
    parent = &XUtil::getNextSiblingElement(parent)->super_DOMNode;
    if ((parent == (DOMNode *)0x0) && (node != (DOMNode *)0x0)) {
      parent = &XUtil::getNextSiblingElement(node)->super_DOMNode;
      node = (DOMNode *)0x0;
    }
    if (parent == (DOMNode *)0x0) {
      return (DOMElement *)0x0;
    }
  } while( true );
}

Assistant:

DOMElement*
SchemaInfo::getTopLevelComponent(const unsigned short compCategory,
                                 const XMLCh* const compName,
                                 const XMLCh* const name) {

    if (fSchemaRootElement == 0 || compCategory >= C_Count)
      return 0;

    DOMElement* child = XUtil::getFirstChildElement(fSchemaRootElement);

    if (!child)
        return 0;

    RefHashTableOf<DOMElement>* compList = fTopLevelComponents[compCategory];

    if (fTopLevelComponents[compCategory] == 0) {

        compList= new (fMemoryManager) RefHashTableOf<DOMElement>(17, false, fMemoryManager);
        fTopLevelComponents[compCategory] = compList;
    }
    else {
        DOMElement* cachedChild = compList->get(name);
        if(cachedChild)
            return cachedChild;

        child = fLastTopLevelComponent[compCategory];
    }

    DOMElement* redefParent = (DOMElement*) child->getParentNode();

    // Parent is not "redefine"
    if (!XMLString::equals(redefParent->getLocalName(),SchemaSymbols::fgELT_REDEFINE))
        redefParent = 0;

    while (child != 0) {

        fLastTopLevelComponent[compCategory]=child;
        if (XMLString::equals(child->getLocalName(), compName)) {

            const XMLCh* cName=child->getAttribute(SchemaSymbols::fgATT_NAME);
            compList->put((void*)cName, child);

            if (XMLString::equals(cName, name))
                return child;
        }
        else if (XMLString::equals(child->getLocalName(),SchemaSymbols::fgELT_REDEFINE)
                 && (!fFailedRedefineList || !fFailedRedefineList->containsElement(child))) { // if redefine

            DOMElement* redefineChild = XUtil::getFirstChildElement(child);

            while (redefineChild != 0) {

                fLastTopLevelComponent[compCategory]=redefineChild;
                if ((!fFailedRedefineList || !fFailedRedefineList->containsElement(redefineChild))
                    && XMLString::equals(redefineChild->getLocalName(), compName)) {

                    const XMLCh* rName=redefineChild->getAttribute(SchemaSymbols::fgATT_NAME);
                    compList->put((void*)rName, redefineChild);

                    if (XMLString::equals(rName, name))
                        return redefineChild;
                }

                redefineChild = XUtil::getNextSiblingElement(redefineChild);
            }
        }

        child = XUtil::getNextSiblingElement(child);

        if (child == 0 && redefParent) {

            child = XUtil::getNextSiblingElement(redefParent);
            redefParent = 0;
        }
    }

    return child;
}